

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O2

void secp256k1_borromean_hash
               (uchar *hash,uchar *m,size_t mlen,uchar *e,size_t elen,size_t ridx,size_t eidx)

{
  uint uVar1;
  uint32_t epos;
  uint32_t ring;
  secp256k1_sha256 local_98;
  
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  uVar1 = (uint)ridx;
  ring = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  epos = (uint)eidx >> 0x18 | ((uint)eidx & 0xff0000) >> 8 | ((uint)eidx & 0xff00) << 8 |
         (uint)eidx << 0x18;
  secp256k1_sha256_write(&local_98,e,elen);
  secp256k1_sha256_write(&local_98,m,mlen);
  secp256k1_sha256_write(&local_98,(uchar *)&ring,4);
  secp256k1_sha256_write(&local_98,(uchar *)&epos,4);
  secp256k1_sha256_finalize(&local_98,hash);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_borromean_hash(unsigned char *hash, const unsigned char *m, size_t mlen, const unsigned char *e, size_t elen,
 size_t ridx, size_t eidx) {
    uint32_t ring;
    uint32_t epos;
    secp256k1_sha256 sha256_en;
    secp256k1_sha256_initialize(&sha256_en);
    ring = BE32((uint32_t)ridx);
    epos = BE32((uint32_t)eidx);
    secp256k1_sha256_write(&sha256_en, e, elen);
    secp256k1_sha256_write(&sha256_en, m, mlen);
    secp256k1_sha256_write(&sha256_en, (unsigned char*)&ring, 4);
    secp256k1_sha256_write(&sha256_en, (unsigned char*)&epos, 4);
    secp256k1_sha256_finalize(&sha256_en, hash);
}